

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

void mg_mqtt_subscribe(mg_connection *nc,mg_mqtt_topic_expression *topics,size_t topics_len,
                      uint16_t message_id)

{
  size_t sVar1;
  char *__s;
  size_t sVar2;
  uint8_t *buf;
  uint16_t topic_len_n;
  uint16_t message_id_n;
  undefined1 local_34 [2];
  undefined1 local_32 [2];
  
  sVar1 = (nc->send_mbuf).len;
  mg_send(nc,local_32,2);
  if (topics_len != 0) {
    buf = &topics->qos;
    do {
      strlen(((mg_mqtt_topic_expression *)(buf + -8))->topic);
      mg_send(nc,local_34,2);
      __s = ((mg_mqtt_topic_expression *)(buf + -8))->topic;
      sVar2 = strlen(__s);
      mg_send(nc,__s,(int)sVar2);
      mg_send(nc,buf,1);
      buf = buf + 0x10;
      topics_len = topics_len - 1;
    } while (topics_len != 0);
  }
  mg_mqtt_prepend_header(nc,'\b','\x02',(nc->send_mbuf).len - sVar1);
  return;
}

Assistant:

void mg_mqtt_subscribe(struct mg_connection *nc,
                       const struct mg_mqtt_topic_expression *topics,
                       size_t topics_len, uint16_t message_id) {
    size_t old_len = nc->send_mbuf.len;

    uint16_t message_id_n = htons(message_id);
    size_t i;

    mg_send(nc, (char *) &message_id_n, 2);
    for (i = 0; i < topics_len; i++) {
        uint16_t topic_len_n = htons(strlen(topics[i].topic));
        mg_send(nc, &topic_len_n, 2);
        mg_send(nc, topics[i].topic, strlen(topics[i].topic));
        mg_send(nc, &topics[i].qos, 1);
    }

    mg_mqtt_prepend_header(nc, MG_MQTT_CMD_SUBSCRIBE, MG_MQTT_QOS(1),
                           nc->send_mbuf.len - old_len);
}